

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBlock::FinalizeObject
          (LargeHeapBlock *this,Recycler *recycler,LargeObjectHeader *header)

{
  size_t *psVar1;
  uint uVar2;
  LargeObjectHeader *pLVar3;
  HeapInfo *pHVar4;
  code *pcVar5;
  bool bVar6;
  uchar uVar7;
  undefined4 *puVar8;
  ushort uVar9;
  ushort uVar10;
  
  if ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] != header
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x74f,"(this->HeaderList()[header->objectIndex] == header)",
                       "this->HeaderList()[header->objectIndex] == header");
    if (!bVar6) goto LAB_006f36aa;
    *puVar8 = 0;
  }
  uVar7 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
  if (-1 < (char)uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x750,
                       "(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit)",
                       "header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit");
    if (!bVar6) {
LAB_006f36aa:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  (*(code *)**(undefined8 **)(header + 1))(header + 1,0);
  pLVar3 = this->pendingDisposeObject;
  pHVar4 = this->heapInfo;
  uVar2 = pHVar4->recycler->Cookie;
  uVar9 = (ushort)uVar2;
  uVar10 = header->attributesAndChecksum ^ uVar9;
  header->attributesAndChecksum =
       (((ushort)((ulong)pLVar3 >> 0x18) & 0xff ^ (ushort)pLVar3 ^
        (ushort)((ulong)pLVar3 >> 0x10) ^ (ushort)((ulong)pLVar3 >> 8)) & 0xff ^ uVar10 >> 8 |
       uVar10 & 0xff00) ^ uVar9;
  header->next = (LargeObjectHeader *)((ulong)pLVar3 ^ (ulong)uVar2);
  this->pendingDisposeObject = header;
  (&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] = (_func_int **)0x0;
  psVar1 = &pHVar4->pendingDisposableObjectCount;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void
LargeHeapBlock::FinalizeObject(Recycler* recycler, LargeObjectHeader* header)
{
    // The header count can also be null if this object has already been finalized
    // but this method should never be called if the header list header is null
    Assert(this->HeaderList()[header->objectIndex] == header);
    Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit);

    // Call finalize to do clean up that needs to be done immediately
    // (e.g. Clear the ITrackable alias reference, so it can't be revived during
    // other finalizers or concurrent sweep)
    // Call it only if it hasn't already been finalized
    ((FinalizableObject *)header->GetAddress())->Finalize(false);
    header->SetNext(this->heapInfo->recycler->Cookie, this->pendingDisposeObject);
    this->pendingDisposeObject = header;

    // Null out the header in the header list- this means that this object has already
    // been finalized and is just pending dispose
    this->HeaderList()[header->objectIndex] = nullptr;

#ifdef RECYCLER_FINALIZE_CHECK
    this->heapInfo->pendingDisposableObjectCount++;
#endif
}